

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O2

cl_uint __thiscall CLIntercept::getRefCount(CLIntercept *this,cl_event event)

{
  cl_uint refCount;
  
  refCount = 0;
  (*(this->m_Dispatch).clGetEventInfo)(event,0x11d2,4,&refCount,(size_t *)0x0);
  return refCount;
}

Assistant:

inline cl_uint CLIntercept::getRefCount( cl_event event ) const
{
    cl_uint refCount = 0;
    dispatch().clGetEventInfo(
        event,
        CL_EVENT_REFERENCE_COUNT,
        sizeof(refCount),
        &refCount,
        NULL);
    return refCount;
}